

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SADx3Test_UnalignedRef_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SADx3Test_UnalignedRef_Test> *this)

{
  SADx3Test *this_00;
  
  WithParamInterface<std::tuple<int,int,void(*)(unsigned_char_const*,int,unsigned_char_const*const*,int,unsigned_int*),int>>
  ::parameter_ = &this->parameter_;
  this_00 = (SADx3Test *)operator_new(0x48);
  anon_unknown.dwarf_259311b::SADx3Test::SADx3Test(this_00);
  (this_00->
  super_WithParamInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__SADx3Test_01069c80;
  (this_00->super_SADTestBase).super_Test._vptr_Test =
       (_func_int **)&PTR__SADx3Test_UnalignedRef_Test_01069cb0;
  return &(this_00->super_SADTestBase).super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }